

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

bool __thiscall deqp::gls::DrawTest::compare(DrawTest *this,Primitive primitiveType)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  TextureFormat TVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar11;
  ulong __n;
  ulong uVar12;
  Surface *pSVar13;
  ConstPixelBufferAccess *pCVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int x;
  ChannelOrder CVar15;
  int iVar16;
  int y;
  uint uVar17;
  long lVar18;
  allocator<char> local_5d7;
  allocator<char> local_5d6;
  allocator<char> local_5d5;
  allocator<char> local_5d4;
  allocator<char> local_5d3;
  allocator<char> local_5d2;
  allocator<char> local_5d1;
  Surface *local_5d0;
  uint local_5c4;
  ulong local_5c0;
  Surface *local_5b8;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  uint local_5a4;
  IVec3 renderTargetThreshold;
  allocator<char> local_591;
  ulong local_590;
  TextureFormat local_588;
  AttributePack *local_580;
  IVec3 local_574;
  IVec4 local_568;
  TextureFormat local_550;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  uint local_534;
  PixelBufferAccess errorAccess;
  IVec4 local_508;
  AttributePack *local_4f8;
  RGBA screenPixel;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  ConstPixelBufferAccess local_430;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  TextureLevel errorMask;
  RGBA c3;
  uint uStack_35c;
  RGBA c2;
  RGBA c1;
  ChannelType CStack_23c;
  ChannelOrder local_238 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [23];
  RGBA refPixel;
  int iStack_bc;
  
  local_580 = this->m_rrArrayPack;
  local_5b8 = &local_580->m_screen;
  local_4f8 = this->m_glArrayPack;
  local_5d0 = &local_4f8->m_screen;
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar9) + 0x20) < 2) {
    if (primitiveType < PRIMITIVE_LAST) {
      if ((0x1f0U >> (primitiveType & 0x1f) & 1) == 0) {
        if ((0x60eU >> (primitiveType & 0x1f) & 1) == 0) {
          pTVar11 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
          tcu::Surface::getAccess((ConstPixelBufferAccess *)&c1,local_5b8);
          tcu::Surface::getAccess((ConstPixelBufferAccess *)&c2,local_5d0);
          _c3 = *(pointer *)&this->m_maxDiffRed;
          _refPixel = (pointer)0x100000001;
          bVar6 = tcu::intThresholdPositionDeviationErrorThresholdCompare
                            (pTVar11,"CompareResult","Result of rendering",
                             (ConstPixelBufferAccess *)&c1,(ConstPixelBufferAccess *)&c2,
                             (UVec4 *)&c3,(IVec3 *)&refPixel,true,0,COMPARE_LOG_RESULT);
          return bVar6;
        }
        iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
        c3 = tcu::PixelFormat::getColorThreshold
                       ((PixelFormat *)(CONCAT44(extraout_var_00,iVar9) + 8));
        tcu::RGBA::toIVec(&c2);
        local_238[0] = R;
        local_238[1] = A;
        local_230[0]._M_allocated_capacity._0_4_ = 2;
        _c1 = (TextureFormat)&c2;
        tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&renderTargetThreshold);
        local_550 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        local_574.m_data[0] = this->m_maxDiffRed;
        local_574.m_data[1] = this->m_maxDiffGreen;
        local_574.m_data[2] = this->m_maxDiffBlue;
        local_568.m_data[0] = 0;
        local_568.m_data[1] = 0xff;
        local_568.m_data[2] = 0;
        local_568.m_data[3] = 0xff;
        local_508.m_data[0] = 0xff;
        local_508.m_data[1] = 0;
        local_508.m_data[2] = 0;
        local_508.m_data[3] = 0xff;
        iVar9 = (local_580->m_screen).m_width;
        iVar10 = (local_580->m_screen).m_height;
        c1.m_value = RGB;
        CStack_23c = UNORM_INT8;
        local_544 = local_574.m_data[2];
        local_540 = local_574.m_data[1];
        local_53c = local_574.m_data[0];
        tcu::TextureLevel::TextureLevel(&errorMask,(TextureFormat *)&c1,iVar9,iVar10,1);
        tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,0,0,iVar9,1);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        local_538 = iVar10 + -1;
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,0,local_538,iVar9,1);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,0,0,1,iVar10);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        iVar9 = iVar9 + -1;
        __n = 0;
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,iVar9,0,1,iVar10);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        local_590 = 0;
        local_5b0 = 2;
        local_5a8 = 0;
        uVar12 = 1;
        local_5ac = iVar9;
        while ((int)uVar12 < local_538) {
          local_534 = (int)uVar12 + 1;
          local_5c0 = uVar12;
          CVar15 = A;
LAB_0085e5d3:
          if ((int)CVar15 < iVar9) {
            iVar10 = (int)uVar12;
            local_5a4 = *(uint *)((long)(local_580->m_screen).m_pixels.m_ptr +
                                 (long)(int)((local_580->m_screen).m_width * iVar10 + CVar15) * 4);
            refPixel.m_value = local_5a4;
            local_5c4 = *(uint *)((long)(local_4f8->m_screen).m_pixels.m_ptr +
                                 (long)(int)((local_4f8->m_screen).m_width * iVar10 + CVar15) * 4);
            screenPixel.m_value = local_5c4;
            bVar6 = colorsEqual(&refPixel,&screenPixel,&local_574);
            if (!bVar6) {
              bVar6 = pixelNeighborhoodContainsColor(local_5d0,CVar15,iVar10,&refPixel,&local_574);
              bVar7 = pixelNeighborhoodContainsColor
                                (local_5b8,CVar15,iVar10,&screenPixel,&local_574);
              uVar12 = local_5c0;
              if (bVar6 && bVar7) goto LAB_0085e66e;
              iVar9 = (local_580->m_screen).m_width;
              pvVar3 = (local_580->m_screen).m_pixels.m_ptr;
              local_588.order = CVar15 + A;
              iVar16 = (int)local_590 * iVar9;
              lVar18 = 4;
              iVar10 = iVar16 + CVar15;
              do {
                lVar18 = lVar18 + -1;
                if (lVar18 == 0) {
                  iVar10 = local_5b0 * iVar9;
                  iVar9 = iVar9 * (int)local_5c0;
                  lVar18 = 0;
                  goto LAB_0085e76c;
                }
                c1.m_value = *(ChannelOrder *)((long)pvVar3 + (long)(iVar10 + -1) * 4);
                c2.m_value = *(deUint32 *)((long)pvVar3 + (long)iVar10 * 4);
                c3.m_value = *(undefined4 *)((long)pvVar3 + (long)(iVar10 + 1) * 4);
                bVar6 = isEdgeTriplet(&c1,&c2,&c3,&renderTargetThreshold);
                iVar10 = iVar10 + iVar9;
              } while (!bVar6);
              goto LAB_0085e7cf;
            }
LAB_0085e66e:
            c1.m_value = getVisualizationGrayscaleColor(&screenPixel);
            CStack_23c = 0xff;
            local_238[1] = 0xff;
            local_238[0] = c1.m_value;
            __n = uVar12 & 0xffffffff;
            tcu::PixelBufferAccess::setPixel(&errorAccess,(UVec4 *)&c1,CVar15,(int)uVar12,0);
            CVar15 = CVar15 + A;
            goto LAB_0085e5d3;
          }
          local_590 = (ulong)((int)local_590 + 1);
          local_5b0 = local_5b0 + 1;
          uVar12 = (ulong)local_534;
        }
        _c1 = local_550;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        std::operator<<((ostream *)local_238,"Comparing images:\n");
        iVar9 = local_5a8;
        std::operator<<((ostream *)local_238,"\tallowed deviation in pixel positions = 1\n");
        std::operator<<((ostream *)local_238,"\tnumber of allowed invalid pixels = ");
        std::ostream::operator<<((ostringstream *)local_238,10);
        std::operator<<((ostream *)local_238,"\n");
        std::operator<<((ostream *)local_238,"\tnumber of invalid pixels = ");
        std::ostream::operator<<((ostringstream *)local_238,iVar9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&c1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        bVar6 = iVar9 < 0xb;
        if (iVar9 < 0xb) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&c3,"CompareResult",(allocator<char> *)&local_450);
          TVar4 = local_550;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&refPixel,"Result of rendering",(allocator<char> *)&local_470);
          tcu::LogImageSet::LogImageSet((LogImageSet *)&c2,(string *)&c3,(string *)&refPixel);
          CVar15 = TVar4.order;
          tcu::LogImageSet::write((LogImageSet *)&c2,CVar15,__buf,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&screenPixel,"Result",(allocator<char> *)&local_490);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,"Result",(allocator<char> *)&local_4b0);
          pSVar13 = local_5d0;
          tcu::LogImage::LogImage
                    ((LogImage *)&c1,(string *)&screenPixel,(string *)&local_430,local_5d0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&c1,CVar15,__buf_00,(size_t)pSVar13);
          tcu::TestLog::endImageSet((TestLog *)TVar4);
          tcu::LogImage::~LogImage((LogImage *)&c1);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&screenPixel);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&c2);
          std::__cxx11::string::~string((string *)&refPixel);
          std::__cxx11::string::~string((string *)&c3);
        }
        else {
          _c1 = local_550;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
          std::operator<<((ostream *)local_238,"Image comparison failed. Color threshold = (");
          std::ostream::operator<<((ostringstream *)local_238,local_53c);
          std::operator<<((ostream *)local_238,", ");
          std::ostream::operator<<((ostringstream *)local_238,local_540);
          std::operator<<((ostream *)local_238,", ");
          std::ostream::operator<<((ostringstream *)local_238,local_544);
          std::operator<<((ostream *)local_238,")");
          pTVar11 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&c1,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"CompareResult",&local_5d1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_470,"Result of rendering",&local_5d2);
          tcu::LogImageSet::LogImageSet((LogImageSet *)&screenPixel,&local_450,&local_470);
          iVar9 = (int)pTVar11;
          tcu::LogImageSet::write((LogImageSet *)&screenPixel,iVar9,__buf_03,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_490,"Result",&local_5d3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b0,"Result",&local_5d4);
          pSVar13 = local_5d0;
          tcu::LogImage::LogImage
                    ((LogImage *)&c2,&local_490,&local_4b0,local_5d0,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::LogImage::write((LogImage *)&c2,iVar9,__buf_04,(size_t)pSVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"Reference",&local_5d5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"Reference",&local_5d6);
          pSVar13 = local_5b8;
          tcu::LogImage::LogImage
                    ((LogImage *)&c3,&local_3a8,&local_3c8,local_5b8,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::LogImage::write((LogImage *)&c3,iVar9,__buf_05,(size_t)pSVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"ErrorMask",&local_5d7);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"Error mask",&local_591);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_430,&errorMask);
          pCVar14 = &local_430;
          tcu::LogImage::LogImage
                    ((LogImage *)&refPixel,&local_3e8,&local_408,pCVar14,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&refPixel,iVar9,__buf_06,(size_t)pCVar14);
          tcu::TestLog::endImageSet(pTVar11);
          tcu::LogImage::~LogImage((LogImage *)&refPixel);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)&local_3e8);
          tcu::LogImage::~LogImage((LogImage *)&c3);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3a8);
          tcu::LogImage::~LogImage((LogImage *)&c2);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::__cxx11::string::~string((string *)&local_490);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&screenPixel);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        }
      }
      else {
        TVar4 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        renderTargetThreshold.m_data[0] = this->m_maxDiffRed;
        local_5ac = this->m_maxDiffGreen;
        local_5b0 = this->m_maxDiffBlue;
        local_590 = CONCAT44(local_590._4_4_,renderTargetThreshold.m_data[0]);
        local_568.m_data[0] = 0;
        local_568.m_data[1] = 0xff;
        local_568.m_data[2] = 0;
        local_568.m_data[3] = 0xff;
        local_508.m_data[0] = 0xff;
        local_508.m_data[1] = 0;
        local_508.m_data[2] = 0;
        local_508.m_data[3] = 0xff;
        iVar9 = (local_580->m_screen).m_width;
        iVar10 = (local_580->m_screen).m_height;
        c1.m_value = RGB;
        CStack_23c = UNORM_INT8;
        renderTargetThreshold.m_data[1] = local_5ac;
        renderTargetThreshold.m_data[2] = local_5b0;
        tcu::TextureLevel::TextureLevel(&errorMask,(TextureFormat *)&c1,iVar9,iVar10,1);
        tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,0,0,iVar9,1);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        local_5c0 = CONCAT44(local_5c0._4_4_,iVar10 + -1);
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,0,iVar10 + -1,iVar9,1);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,0,0,1,iVar10);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        local_5a4 = iVar9 - 1;
        uVar12 = 0;
        local_588 = TVar4;
        tcu::getSubregion((PixelBufferAccess *)&c1,&errorAccess,local_5a4,0,1,iVar10);
        tcu::clear((PixelBufferAccess *)&c1,&local_568);
        local_5c4 = 0;
        for (uVar17 = 1; TVar4 = local_588, (int)uVar17 < (int)local_5c0; uVar17 = uVar17 + 1) {
          for (iVar9 = 1; iVar9 < (int)local_5a4; iVar9 = iVar9 + 1) {
            uVar1 = *(uint *)((long)(local_580->m_screen).m_pixels.m_ptr +
                             (long)(int)((local_580->m_screen).m_width * uVar17 + iVar9) * 4);
            uVar2 = *(uint *)((long)(local_4f8->m_screen).m_pixels.m_ptr +
                             (long)(int)((local_4f8->m_screen).m_width * uVar17 + iVar9) * 4);
            c3.m_value = uVar2;
            c2.m_value = uVar1;
            bVar6 = colorsEqual(&c2,&c3,&renderTargetThreshold);
            bVar7 = true;
            bVar8 = true;
            if (!bVar6) {
              bVar7 = pixelNeighborhoodContainsColor
                                (local_5b8,iVar9,uVar17,&c3,&renderTargetThreshold);
              bVar8 = pixelNeighborhoodContainsColor
                                (local_5d0,iVar9,uVar17,&c2,&renderTargetThreshold);
            }
            if ((bVar7 == false) || (bVar8 == false)) {
              bVar6 = pixelNearLineIntersection(iVar9,uVar17,local_5b8);
              if ((bVar6) || (bVar6 = pixelNearLineIntersection(iVar9,uVar17,local_5d0), bVar6)) {
                bVar6 = pixelNeighborhoodContainsCoverage
                                  (local_5b8,iVar9,uVar17,(uVar2 & 0xffffff) != 0);
                bVar7 = pixelNeighborhoodContainsCoverage
                                  (local_5d0,iVar9,uVar17,(uVar1 & 0xffffff) != 0);
                if ((bVar6) && (bVar7)) {
                  c1.m_value = getVisualizationGrayscaleColor(&c3);
                  CStack_23c = 0xff;
                  local_238[1] = 0xff;
                  local_238[0] = c1.m_value;
                  uVar12 = (ulong)uVar17;
                  tcu::PixelBufferAccess::setPixel(&errorAccess,(UVec4 *)&c1,iVar9,uVar17,0);
                }
                else {
                  uVar12 = (ulong)uVar17;
                  tcu::PixelBufferAccess::setPixel(&errorAccess,&local_508,iVar9,uVar17,0);
                  local_5c4 = local_5c4 + 1;
                }
              }
              else {
                uVar12 = (ulong)uVar17;
                tcu::PixelBufferAccess::setPixel(&errorAccess,&local_508,iVar9,uVar17,0);
                local_5c4 = local_5c4 + 1;
              }
            }
            else {
              c1.m_value = getVisualizationGrayscaleColor(&c3);
              CStack_23c = 0xff;
              local_238[1] = 0xff;
              local_238[0] = c1.m_value;
              uVar12 = (ulong)uVar17;
              tcu::PixelBufferAccess::setPixel(&errorAccess,(UVec4 *)&c1,iVar9,uVar17,0);
            }
          }
        }
        _c1 = local_588;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        std::operator<<((ostream *)local_238,"Comparing images:\n");
        uVar17 = local_5c4;
        std::operator<<((ostream *)local_238,"\tallowed deviation in pixel positions = 1\n");
        std::operator<<((ostream *)local_238,"\tnumber of allowed invalid pixels = ");
        std::ostream::operator<<((ostringstream *)local_238,5);
        std::operator<<((ostream *)local_238,"\n");
        std::operator<<((ostream *)local_238,"\tnumber of invalid pixels = ");
        std::ostream::operator<<((ostringstream *)local_238,uVar17);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&c1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        bVar6 = (int)uVar17 < 6;
        if ((int)uVar17 < 6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&c3,"CompareResult",(allocator<char> *)&local_450);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&refPixel,"Result of rendering",(allocator<char> *)&local_470);
          tcu::LogImageSet::LogImageSet((LogImageSet *)&c2,(string *)&c3,(string *)&refPixel);
          tcu::LogImageSet::write((LogImageSet *)&c2,TVar4.order,__buf_01,uVar12);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&screenPixel,"Result",(allocator<char> *)&local_490);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,"Result",(allocator<char> *)&local_4b0);
          pSVar13 = local_5d0;
          tcu::LogImage::LogImage
                    ((LogImage *)&c1,(string *)&screenPixel,(string *)&local_430,local_5d0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&c1,TVar4.order,__buf_02,(size_t)pSVar13);
          tcu::TestLog::endImageSet((TestLog *)TVar4);
          tcu::LogImage::~LogImage((LogImage *)&c1);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&screenPixel);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&c2);
          std::__cxx11::string::~string((string *)&refPixel);
          std::__cxx11::string::~string((string *)&c3);
        }
        else {
          _c1 = TVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
          std::operator<<((ostream *)local_238,"Image comparison failed. Color threshold = (");
          std::ostream::operator<<((ostringstream *)local_238,(int)local_590);
          std::operator<<((ostream *)local_238,", ");
          std::ostream::operator<<((ostringstream *)local_238,local_5ac);
          std::operator<<((ostream *)local_238,", ");
          std::ostream::operator<<((ostringstream *)local_238,local_5b0);
          std::operator<<((ostream *)local_238,")");
          pTVar11 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&c1,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"CompareResult",(allocator<char> *)&local_574);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_470,"Result of rendering",&local_5d1);
          tcu::LogImageSet::LogImageSet((LogImageSet *)&screenPixel,&local_450,&local_470);
          iVar9 = (int)pTVar11;
          tcu::LogImageSet::write((LogImageSet *)&screenPixel,iVar9,__buf_07,uVar12);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_490,"Result",&local_5d2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b0,"Result",&local_5d3);
          pSVar13 = local_5d0;
          tcu::LogImage::LogImage
                    ((LogImage *)&c2,&local_490,&local_4b0,local_5d0,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::LogImage::write((LogImage *)&c2,iVar9,__buf_08,(size_t)pSVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"Reference",&local_5d4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"Reference",&local_5d5);
          pSVar13 = local_5b8;
          tcu::LogImage::LogImage
                    ((LogImage *)&c3,&local_3a8,&local_3c8,local_5b8,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::LogImage::write((LogImage *)&c3,iVar9,__buf_09,(size_t)pSVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"ErrorMask",&local_5d6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"Error mask",&local_5d7);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_430,&errorMask);
          pCVar14 = &local_430;
          tcu::LogImage::LogImage
                    ((LogImage *)&refPixel,&local_3e8,&local_408,pCVar14,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&refPixel,iVar9,__buf_10,(size_t)pCVar14);
          tcu::TestLog::endImageSet(pTVar11);
          tcu::LogImage::~LogImage((LogImage *)&refPixel);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)&local_3e8);
          tcu::LogImage::~LogImage((LogImage *)&c3);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3a8);
          tcu::LogImage::~LogImage((LogImage *)&c2);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::__cxx11::string::~string((string *)&local_490);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&screenPixel);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        }
      }
      tcu::TextureLevel::~TextureLevel(&errorMask);
    }
    else {
      bVar6 = false;
    }
  }
  else {
    _c1 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::operator<<((ostream *)local_238,
                    "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&c1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    pTVar11 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    tcu::Surface::getAccess((ConstPixelBufferAccess *)&c1,local_5b8);
    tcu::Surface::getAccess((ConstPixelBufferAccess *)&c2,local_5d0);
    bVar6 = tcu::fuzzyCompare(pTVar11,"Compare Results","Compare Results",
                              (ConstPixelBufferAccess *)&c1,(ConstPixelBufferAccess *)&c2,0.3,
                              COMPARE_LOG_RESULT);
  }
  return bVar6;
  while( true ) {
    iVar5 = (int)lVar18;
    c1.m_value = *(ChannelOrder *)((long)pvVar3 + (long)(int)(iVar16 + CVar15 + -1 + iVar5) * 4);
    c2.m_value = *(deUint32 *)((long)pvVar3 + (long)(int)(iVar9 + CVar15 + -1 + iVar5) * 4);
    c3.m_value = *(undefined4 *)((long)pvVar3 + (long)(int)(iVar10 + CVar15 + -1 + iVar5) * 4);
    bVar6 = isEdgeTriplet(&c1,&c2,&c3,&renderTargetThreshold);
    lVar18 = lVar18 + 1;
    if (bVar6) break;
LAB_0085e76c:
    if (lVar18 == 3) {
      __n = local_5c0;
      tcu::PixelBufferAccess::setPixel(&errorAccess,&local_508,CVar15,(int)local_5c0,0);
      local_5a8 = local_5a8 + 1;
      uVar12 = local_5c0;
      iVar9 = local_5ac;
      CVar15 = local_588.order;
      goto LAB_0085e5d3;
    }
  }
LAB_0085e7cf:
  uVar17 = local_5c4 & 0xffffff;
  iVar9 = (int)local_5c0;
  bVar6 = pixelNeighborhoodContainsCoverage(local_5d0,CVar15,iVar9,(local_5a4 & 0xffffff) != 0);
  bVar7 = pixelNeighborhoodContainsCoverage(local_5b8,CVar15,iVar9,uVar17 != 0);
  iVar9 = local_5ac;
  uVar12 = local_5c0;
  if ((bVar6) && (bVar7)) {
    c1.m_value = getVisualizationGrayscaleColor(&screenPixel);
    uVar12 = local_5c0;
    CStack_23c = 0xff;
    local_238[1] = 0xff;
    local_238[0] = c1.m_value;
    __n = local_5c0 & 0xffffffff;
    tcu::PixelBufferAccess::setPixel(&errorAccess,(UVec4 *)&c1,CVar15,(int)local_5c0,0);
  }
  else {
    __n = local_5c0 & 0xffffffff;
    tcu::PixelBufferAccess::setPixel(&errorAccess,&local_508,CVar15,(int)local_5c0,0);
    local_5a8 = local_5a8 + 1;
  }
  CVar15 = local_588.order;
  goto LAB_0085e5d3;
}

Assistant:

bool DrawTest::compare (gls::DrawTestSpec::Primitive primitiveType)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		return tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 0.3f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		const PrimitiveClass	primitiveClass							= getDrawPrimitiveClass(primitiveType);
		const int				maxAllowedInvalidPixelsWithPoints		= 0;	//!< points are unlikely to have overlapping fragments
		const int				maxAllowedInvalidPixelsWithLines		= 5;	//!< line are allowed to have a few bad pixels
		const int				maxAllowedInvalidPixelsWithTriangles	= 10;

		switch (primitiveClass)
		{
			case PRIMITIVECLASS_POINT:
			{
				// Point are extremely unlikely to have overlapping regions, don't allow any no extra / missing pixels
				return tcu::intThresholdPositionDeviationErrorThresholdCompare(m_testCtx.getLog(),
																			   "CompareResult",
																			   "Result of rendering",
																			   ref.getAccess(),
																			   screen.getAccess(),
																			   tcu::UVec4(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 256),
																			   tcu::IVec3(1, 1, 0),					//!< 3x3 search kernel
																			   true,								//!< relax comparison on the image boundary
																			   maxAllowedInvalidPixelsWithPoints,	//!< error threshold
																			   tcu::COMPARE_LOG_RESULT);
			}

			case PRIMITIVECLASS_LINE:
			{
				// Lines can potentially have a large number of overlapping pixels. Pixel comparison may potentially produce
				// false negatives in such pixels if for example the pixel in question is overdrawn by another line in the
				// reference image but not in the resultin image. Relax comparison near line intersection points (areas) and
				// compare only coverage, not color, in such pixels
				return intersectionRelaxedLineImageCompare(m_testCtx.getLog(),
														   "CompareResult",
														   "Result of rendering",
														   ref,
														   screen,
														   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
														   maxAllowedInvalidPixelsWithLines);
			}

			case PRIMITIVECLASS_TRIANGLE:
			{
				// Triangles are likely to partially or fully overlap. Pixel difference comparison is fragile in pixels
				// where there could be potential overlapping since the  pixels might be covered by one triangle in the
				// reference image and by the other in the result image. Relax comparsion near primitive edges and
				// compare only coverage, not color, in such pixels.
				const tcu::IVec3	renderTargetThreshold					= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().xyz();

				return edgeRelaxedImageCompare(m_testCtx.getLog(),
											   "CompareResult",
											   "Result of rendering",
											   ref,
											   screen,
											   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
											   renderTargetThreshold,
											   maxAllowedInvalidPixelsWithTriangles);
			}

			default:
				DE_ASSERT(false);
				return false;
		}
	}
}